

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void lts2::PerformWL1OnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float lambda,float patchMean)

{
  float patchMean_00;
  float lambda_00;
  float iterations_00;
  _InputArray *p_Var1;
  Mat *LBD_00;
  int iVar2;
  double *pdVar3;
  undefined1 auVar4 [12];
  int local_640;
  int local_63c;
  Mat local_5e8 [96];
  Mat local_588 [8];
  Mat target;
  allocator local_521;
  string local_520 [32];
  Size_<int> local_500;
  _InputArray local_4f8;
  undefined1 local_4e0 [8];
  Scalar mean;
  undefined1 local_4b8 [4];
  float pmean;
  _OutputArray local_4a0 [4];
  undefined1 local_440 [8];
  Rect ROI;
  int x;
  int y;
  Mat resultPatch;
  Mat local_3c8 [8];
  Mat freak;
  Mat local_368 [8];
  Mat inputPatch;
  Size_<int> local_308;
  MatExpr local_300 [352];
  MatExpr local_1a0 [8];
  Mat patchOnes;
  Scalar_<double> local_140;
  MatSize local_120 [8];
  undefined1 local_118 [8];
  Mat ocount;
  Scalar_<double> local_b8;
  _InputArray local_98;
  MatSize local_7c [8];
  undefined4 local_74;
  undefined8 local_70;
  allocator local_61;
  string local_60 [36];
  float local_3c;
  float local_38;
  float patchMean_local;
  float lambda_local;
  int iterations_local;
  Mat *result_local;
  LBDOperator *LBD_local;
  Point *patchOffset_local;
  Size *patchSize_local;
  Mat *anImage_local;
  
  local_3c = patchMean;
  local_38 = lambda;
  patchMean_local = (float)iterations;
  _lambda_local = (_InputArray *)result;
  result_local = (Mat *)LBD;
  LBD_local = (LBDOperator *)patchOffset;
  patchOffset_local = (Point *)patchSize;
  patchSize_local = (Size *)anImage;
  iVar2 = cv::Mat::type(anImage);
  if ((iVar2 == 5) &&
     (iVar2 = cv::Mat::channels((Mat *)patchSize_local), p_Var1 = _lambda_local, iVar2 == 1)) {
    cv::MatSize::operator()(local_7c);
    cv::Mat::create(p_Var1,local_7c,5);
    p_Var1 = _lambda_local;
    cv::Scalar_<double>::Scalar_(&local_b8,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_98,(Matx<double,_4,_1> *)&local_b8);
    cv::noArray();
    cv::Mat::setTo(p_Var1,&local_98);
    cv::_InputArray::~_InputArray(&local_98);
    cv::MatSize::operator()(local_120);
    cv::Scalar_<double>::Scalar_(&local_140,0.0);
    cv::Mat::Mat((Mat *)local_118,local_120,5,&local_140);
    cv::Size_<int>::Size_(&local_308,patchSize);
    cv::Mat::ones(local_300,&local_308,5);
    cv::MatExpr::operator_cast_to_Mat(local_1a0);
    cv::MatExpr::~MatExpr(local_300);
    cv::Mat::Mat(local_368);
    cv::Mat::Mat(local_3c8);
    cv::Mat::Mat((Mat *)&x);
    if (patchOffset->x < 2) {
      local_63c = 1;
    }
    else {
      local_63c = patchOffset->x;
    }
    patchOffset->x = local_63c;
    if (patchOffset->y < 2) {
      local_640 = 1;
    }
    else {
      local_640 = patchOffset->y;
    }
    patchOffset->y = local_640;
    for (ROI.height = 0; ROI.height < patchSize_local[1].width;
        ROI.height = patchOffset->y + ROI.height) {
      for (ROI.width = 0; ROI.width < patchSize_local[1].height;
          ROI.width = patchOffset->x + ROI.width) {
        cv::Rect_<int>::Rect_
                  ((Rect_<int> *)local_440,ROI.width,ROI.height,patchSize->width,patchSize->height);
        if ((ROI.height + patchSize->height <= patchSize_local[1].width) &&
           (ROI.width + patchSize->width <= patchSize_local[1].height)) {
          cv::Mat::operator()((Mat *)local_4a0,(Rect *)patchSize_local);
          cv::_OutputArray::_OutputArray((_OutputArray *)local_4b8,local_368);
          cv::Mat::copyTo(local_4a0);
          cv::_OutputArray::~_OutputArray((_OutputArray *)local_4b8);
          cv::Mat::~Mat((Mat *)local_4a0);
          mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ = local_3c;
          if (local_3c < 0.0) {
            cv::_InputArray::_InputArray(&local_4f8,local_368);
            cv::noArray();
            cv::mean((_InputArray *)local_4e0,&local_4f8);
            cv::_InputArray::~_InputArray(&local_4f8);
            pdVar3 = cv::Vec<double,_4>::operator[]((Vec<double,_4> *)local_4e0,0);
            mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ = (float)*pdVar3;
          }
          (**(code **)(*(long *)result_local + 0x10))(result_local,local_368,local_3c8);
          LBD_00 = result_local;
          iterations_00 = patchMean_local;
          lambda_00 = local_38;
          cv::Size_<int>::Size_(&local_500,patchSize);
          patchMean_00 = mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_520,"haar",&local_521);
          RealReconstructionWithWL1
                    ((Mat *)&x,(LBDOperator *)LBD_00,local_3c8,(int)iterations_00,lambda_00,
                     &local_500,patchMean_00,(string *)local_520);
          std::__cxx11::string::~string(local_520);
          std::allocator<char>::~allocator((allocator<char> *)&local_521);
          cv::Mat::operator()(local_588,(Rect *)_lambda_local);
          cv::operator+=(local_588,(Mat *)&x);
          cv::Mat::operator()(local_5e8,(Rect *)local_118);
          cv::Mat::operator=(local_588,local_5e8);
          cv::Mat::~Mat(local_5e8);
          cv::operator+=(local_588,(Mat *)local_1a0);
          cv::Mat::~Mat(local_588);
        }
      }
    }
    finalize((Mat *)_lambda_local,(Mat *)local_118);
    cv::Mat::~Mat((Mat *)&x);
    cv::Mat::~Mat(local_3c8);
    cv::Mat::~Mat(local_368);
    cv::Mat::~Mat((Mat *)local_1a0);
    cv::Mat::~Mat((Mat *)local_118);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"anImage.type() == CV_32F && anImage.channels() == 1",&local_61);
  auVar4 = cv::error(-0xd7,local_60,"PerformWL1OnImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                     ,0x237);
  local_74 = auVar4._8_4_;
  local_70 = auVar4._0_8_;
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  _Unwind_Resume(local_70);
}

Assistant:

void lts2::PerformWL1OnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float lambda, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);
      lts2::RealReconstructionWithWL1(resultPatch, LBD, freak, iterations,
                                      lambda, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}